

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoCube.h
# Opt level: O1

void pzgeom::TPZGeoCube::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  long lVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  TPZFNMatrix<12,_double> dphi;
  TPZFNMatrix<4,_double> phi;
  TPZFMatrix<double> local_1e0;
  double local_150 [13];
  TPZFMatrix<double> local_e8;
  double local_58 [5];
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (gradx,3,3);
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (gradx);
  local_e8.fElem = local_58;
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 8;
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018a08f0;
  local_e8.fSize = 4;
  local_e8.fGiven = local_e8.fElem;
  TPZVec<int>::TPZVec(&local_e8.fPivot.super_TPZVec<int>,0);
  local_e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_e8.fPivot.super_TPZVec<int>.fStore = local_e8.fPivot.fExtAlloc;
  local_e8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_e8.fWork.fStore = (double *)0x0;
  local_e8.fWork.fNElements = 0;
  local_e8.fWork.fNAlloc = 0;
  local_e8.fElem = (double *)operator_new__(0x40);
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018a0600;
  local_1e0.fElem = local_150;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 8;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018aee30;
  local_1e0.fSize = 0xc;
  local_1e0.fGiven = local_1e0.fElem;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_1e0.fElem = (double *)operator_new__(0xc0);
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018aeb40;
  pztopology::TPZCube::TShape<double>(loc,&local_e8,&local_1e0);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar2] =
           extraout_XMM0_Qa *
           local_1e0.fElem[local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3] +
           gradx->fElem[lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
         (local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      gradx->fElem[lVar1 + lVar2] =
           extraout_XMM0_Qa_00 *
           local_1e0.fElem[local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 1] +
           gradx->fElem[lVar1 + lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
         (local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      gradx->fElem[lVar1 * 2 + lVar2] =
           extraout_XMM0_Qa_01 *
           local_1e0.fElem[local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 2] +
           gradx->fElem[lVar1 * 2 + lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar3 = lVar3 + 1;
    if (lVar3 == 8) {
      TPZFMatrix<double>::~TPZFMatrix(&local_1e0,&PTR_PTR_018aedf8);
      TPZFMatrix<double>::~TPZFMatrix(&local_e8,&PTR_PTR_018a08b8);
      return;
    }
  } while( true );
}

Assistant:

inline void TPZGeoCube::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 8){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x8." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<12,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        for(int i = 0; i < NNodes; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }